

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Relations.cpp
# Opt level: O2

Relations dg::vr::compose(Relations *lt,Relations *rt)

{
  Type fst;
  Type snd;
  bitset<12UL> bVar1;
  ulong uVar2;
  bool bVar3;
  Type TVar4;
  long lVar5;
  long lVar6;
  Relations result;
  
  bVar1.super__Base_bitset<1UL>._M_w = (_Base_bitset<1UL>)(lt->bits).super__Base_bitset<1UL>._M_w;
  result = (Relations)(rt->bits).super__Base_bitset<1UL>._M_w;
  if ((((ulong)bVar1.super__Base_bitset<1UL>._M_w & 1) == 0) &&
     (uVar2 = (ulong)result.bits.super__Base_bitset<1UL>._M_w & 1,
     result.bits.super__Base_bitset<1UL>._M_w =
          (bitset<12UL>)(bitset<12UL>)bVar1.super__Base_bitset<1UL>._M_w, uVar2 == 0)) {
    result.bits.super__Base_bitset<1UL>._M_w = (bitset<12UL>)(_Base_bitset<1UL>)0x0;
    for (lVar5 = 0; lVar5 != 0x30; lVar5 = lVar5 + 4) {
      fst = *(Type *)((long)&Relations::all + lVar5);
      if (((lt->bits).super__Base_bitset<1UL>._M_w >> ((ulong)fst & 0x3f) & 1) != 0) {
        for (lVar6 = 0; lVar6 != 0x30; lVar6 = lVar6 + 4) {
          snd = *(Type *)((long)&Relations::all + lVar6);
          if ((((rt->bits).super__Base_bitset<1UL>._M_w >> ((ulong)snd & 0x3f) & 1) != 0) &&
             (bVar3 = Relations::transitiveOver(fst,snd), bVar3)) {
            TVar4 = fst;
            if ((((uint)(1L << ((byte)snd & 0x3f)) | (uint)(1L << ((byte)fst & 0x3f))) & 0x2a8) != 0
               ) {
              TVar4 = Relations::getStrict(fst);
            }
            std::bitset<12UL>::set(&result.bits,(ulong)TVar4,true);
          }
        }
      }
    }
    Relations::addImplied(&result);
  }
  return (Relations)result.bits.super__Base_bitset<1UL>._M_w;
}

Assistant:

Relations compose(const Relations &lt, const Relations &rt) {
    if (lt.has(Relations::EQ))
        return rt;
    if (rt.has(Relations::EQ))
        return lt;
    Relations result;
    for (Relations::Type ltRel : Relations::all) {
        if (!lt.has(ltRel))
            continue;

        for (Relations::Type rtRel : Relations::all) {
            if (rt.has(rtRel) && Relations::transitiveOver(ltRel, rtRel)) {
                if (Relations::isStrict(ltRel) || Relations::isStrict(rtRel))
                    result.set(Relations::getStrict(ltRel));
                else
                    result.set(ltRel);
            }
        }
    }
    return result.addImplied();
}